

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Base.cpp
# Opt level: O0

string * __thiscall adios2::format::BP4Base::GetBPVersionFileName(BP4Base *this,string *name)

{
  string *in_RDI;
  string bpName;
  string *bpVersionFileName;
  string *name_00;
  string local_60 [7];
  char in_stack_ffffffffffffffa7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  string local_38;
  
  name_00 = &local_38;
  helper::RemoveTrailingSlash(name_00);
  std::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa7);
  std::operator+(name_00,(char *)in_RDI);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string((string *)&local_38);
  return in_RDI;
}

Assistant:

std::string BP4Base::GetBPVersionFileName(const std::string &name) const noexcept
{
    const std::string bpName = helper::RemoveTrailingSlash(name);
    /* the name of the version file is ".bpversion" */
    const std::string bpVersionFileName(bpName + PathSeparator + ".bpversion");
    return bpVersionFileName;
}